

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void fight_prog_law_subdue(CHAR_DATA *mob,CHAR_DATA *ch)

{
  __type_conflict2 _Var1;
  bool bVar2;
  int iVar3;
  ROOM_INDEX_DATA *pRVar4;
  MOB_INDEX_DATA *this;
  char *pcVar5;
  MEM_DATA *from;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  code *args_2;
  string buffer;
  float chance;
  AFFECT_DATA af;
  ROOM_INDEX_DATA *pRoom;
  int num;
  int vnum;
  int dragon_vnum;
  int hydra_vnum;
  CHAR_DATA *dragon;
  CHAR_DATA *hydra;
  char *in_stack_00000c50;
  CHAR_DATA *in_stack_00000c58;
  AFFECT_DATA *in_stack_fffffffffffffa48;
  int to;
  CHAR_DATA *ch_00;
  int from_00;
  CHAR_DATA *in_stack_fffffffffffffa50;
  CHAR_DATA *in_stack_fffffffffffffa58;
  int vnum_00;
  CHAR_DATA *ch_01;
  CHAR_DATA *in_stack_fffffffffffffa60;
  CHAR_DATA *in_stack_fffffffffffffa68;
  ROOM_INDEX_DATA *in_stack_fffffffffffffa78;
  ROOM_INDEX_DATA *pRVar6;
  CHAR_DATA *in_stack_fffffffffffffa80;
  PATHFIND_DATA *__a;
  char *in_stack_fffffffffffffa88;
  PATHFIND_DATA *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CHAR_DATA *in_stack_fffffffffffffaa0;
  char_data **args;
  undefined4 in_stack_fffffffffffffb74;
  string *in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  string *in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb9c;
  CQueue *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  ROOM_INDEX_DATA *in_stack_fffffffffffffbd8;
  char *pcVar7;
  ROOM_INDEX_DATA *in_stack_fffffffffffffbe0;
  ROOM_INDEX_DATA *in_stack_fffffffffffffbe8;
  CHAR_DATA *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  SPEECH_DATA *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  EXIT_DATA *in_stack_fffffffffffffc10;
  CHAR_DATA *in_stack_fffffffffffffc20;
  string local_3d8 [8];
  CHAR_DATA *in_stack_fffffffffffffc30;
  CHAR_DATA *in_stack_fffffffffffffc38;
  CHAR_DATA *in_stack_fffffffffffffc40;
  CHAR_DATA *in_stack_fffffffffffffc48;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [16];
  format_args in_stack_fffffffffffffcb0;
  string_view in_stack_fffffffffffffcc0;
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [55];
  allocator<char> local_1c1;
  string local_1c0 [36];
  float local_19c;
  char_data *local_198 [3];
  short local_17e;
  short local_17c;
  short local_17a;
  short local_178;
  ulong local_170;
  undefined4 local_160;
  ROOM_INDEX_DATA *local_130;
  int local_128;
  undefined4 local_124;
  int local_120;
  int local_11c;
  CHAR_DATA *local_118;
  CHAR_DATA *local_110;
  undefined1 local_108 [72];
  undefined1 local_c0 [16];
  PC_DATA *local_b0;
  PATHFIND_DATA *local_a0;
  PATHFIND_DATA *local_98;
  MOB_INDEX_DATA *local_90;
  undefined1 local_88 [88];
  PATHFIND_DATA *local_30;
  PATHFIND_DATA *local_28;
  PATHFIND_DATA *local_20;
  char *local_18;
  PATHFIND_DATA *local_10;
  OBJ_DATA *local_8;
  
  local_124 = 0;
  if (in_RDI->pIndexData->vnum == 0x96a) {
    local_11c = 0x969;
    local_120 = 0x968;
  }
  else {
    local_120 = in_RDI->pIndexData->vnum + 1;
    local_11c = in_RDI->pIndexData->vnum + 2;
  }
  local_108._0_8_ = in_RSI;
  local_108._8_8_ = in_RDI;
  local_110 = get_char_room(in_stack_00000c58,in_stack_00000c50);
  if (((local_110 != (CHAR_DATA *)0x0) &&
      (local_118 = get_char_room(in_stack_00000c58,in_stack_00000c50), local_118 != (CHAR_DATA *)0x0
      )) && (bVar2 = is_affected((CHAR_DATA *)local_108._0_8_,(int)gsn_aggressor), bVar2)) {
    local_19c = ((float)*(int *)(local_108._0_8_ + 0x158) /
                (float)(int)*(short *)(local_108._0_8_ + 0x15c)) * 100.0 + 10.0;
    iVar3 = number_percent();
    if ((float)iVar3 <= local_19c) {
      act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
          in_stack_fffffffffffffa48,0);
      act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
          in_stack_fffffffffffffa48,0);
    }
    else {
      stop_fighting(in_stack_fffffffffffffa50,SUB81((ulong)in_stack_fffffffffffffa48 >> 0x38,0));
      stop_fighting(in_stack_fffffffffffffa50,SUB81((ulong)in_stack_fffffffffffffa48 >> 0x38,0));
      *(CHAR_DATA **)(local_108._8_8_ + 0x38) = (CHAR_DATA *)0x0;
      *(int *)(local_108._8_8_ + 0x40) = 0;
      iVar3 = number_range((int)in_stack_fffffffffffffa50,
                           (int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
      if (iVar3 == 1) {
        act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
            in_stack_fffffffffffffa48,0);
      }
      else {
        act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
            in_stack_fffffffffffffa48,0);
      }
      act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
          in_stack_fffffffffffffa48,0);
      act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
          in_stack_fffffffffffffa48,0);
      act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
          in_stack_fffffffffffffa48,0);
      act((char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
          in_stack_fffffffffffffa48,0);
      vnum_00 = (int)((ulong)in_stack_fffffffffffffa58 >> 0x20);
      *(short *)(local_108._0_8_ + 0x1f8) = 4;
      args = local_198;
      init_affect((AFFECT_DATA *)0x681821);
      local_17e = 0;
      local_17c = gsn_subdue;
      local_160 = 5;
      _Var1 = std::pow<int,int>(0,0x681859);
      local_170 = local_170 | (long)_Var1;
      local_17a = 0x3c;
      local_178 = 0xc;
      affect_to_char(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
      iVar3 = (int)(*(MOB_INDEX_DATA **)(local_108._8_8_ + 0x78))->vnum;
      to = (int)((ulong)in_stack_fffffffffffffa48 >> 0x20);
      from_00 = (int)in_stack_fffffffffffffa50;
      if (iVar3 == 0x96a) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0xdae;
          break;
        case 1:
          local_124 = 0xdb3;
          break;
        case 2:
          local_124 = 0xdb5;
          break;
        case 3:
          local_124 = 0xdbc;
          break;
        case 4:
          local_124 = 0xdbd;
        }
      }
      else if (iVar3 == 0xa8c) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0x215;
          break;
        case 1:
          local_124 = 0x216;
          break;
        case 2:
          local_124 = 0x21e;
          break;
        case 3:
          local_124 = 0x227;
        }
      }
      else if (iVar3 == 0xa8f) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0x210;
          break;
        case 1:
          local_124 = 0x211;
          break;
        case 2:
          local_124 = 0x20a;
          break;
        case 3:
          local_124 = 0x20b;
          break;
        case 4:
          local_124 = 0x20c;
        }
      }
      else if (iVar3 == 0xa92) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0x916;
          break;
        case 1:
          local_124 = 0x917;
          break;
        case 2:
          local_124 = 0x918;
          break;
        case 3:
          local_124 = 0x919;
        }
      }
      else if (iVar3 == 0xa95) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0xc9;
          break;
        case 1:
          local_124 = 0xca;
          break;
        case 2:
          local_124 = 0xcb;
          break;
        case 3:
          local_124 = 0xcc;
        }
      }
      else if (iVar3 == 0xa98) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0x90f;
          break;
        case 1:
          local_124 = 0x910;
          break;
        case 2:
          local_124 = 0x911;
          break;
        case 3:
          local_124 = 0x913;
        }
      }
      else if (iVar3 == 0xa9b) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0x91b;
          break;
        case 1:
          local_124 = 0x91c;
          break;
        case 2:
          local_124 = 0x91d;
          break;
        case 3:
          local_124 = 0x91e;
        }
      }
      else if (iVar3 == 0xa9e) {
        local_128 = number_range(from_00,to);
        switch(local_128) {
        case 0:
          local_124 = 0x1778;
          break;
        case 1:
          local_124 = 0x1779;
          break;
        case 2:
          local_124 = 0x177b;
          break;
        case 3:
          local_124 = 0x177e;
        }
      }
      else if (iVar3 == 0xaa1) {
        local_128 = number_range(from_00,to);
        if (local_128 == 0) {
          local_124 = 0x37b1;
        }
        else if (local_128 == 1) {
          local_124 = 0x37bb;
        }
        else if (local_128 == 2) {
          local_124 = 0x37bc;
        }
      }
      local_130 = get_room_index(vnum_00);
      bVar2 = is_affected((CHAR_DATA *)local_108._0_8_,(int)gsn_plasma_thread);
      if (bVar2) {
        affect_strip(in_stack_fffffffffffffa60,vnum_00);
      }
      char_from_room(in_stack_fffffffffffffaa0);
      get_room_index(vnum_00);
      char_to_room(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[59],char_data*&>
                ((CQueue *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                 (string *)in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8,
                 (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
                  *)in_stack_fffffffffffffbe0,(char (*) [59])in_stack_fffffffffffffbd8,
                 (char_data **)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                ((CQueue *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (_func_void_char_data_ptr *)CONCAT44(in_stack_fffffffffffffb74,iVar3),args);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator(&local_249);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator(&local_221);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,short&>
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90,
                 (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 (_func_void_char_data_ptr_int *)in_stack_fffffffffffffb80,
                 (char_data **)in_stack_fffffffffffffb78,(short *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator(&local_299);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator(&local_271);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90,
                 (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 (_func_void_char_data_ptr_room_index_data_ptr *)in_stack_fffffffffffffb80,
                 (char_data **)in_stack_fffffffffffffb78,
                 (room_index_data **)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                ((CQueue *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (_func_void_char_data_ptr *)CONCAT44(in_stack_fffffffffffffb74,iVar3),args);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcc8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcc7);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator(&local_311);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[79],char_data*&>
                ((CQueue *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                 (string *)in_stack_fffffffffffffc00,
                 (string *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
                  *)in_stack_fffffffffffffbf0,(char (*) [79])in_stack_fffffffffffffbe8,
                 &in_stack_fffffffffffffc20->next);
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator(&local_389);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator(&local_361);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                 (allocator<char> *)in_stack_fffffffffffffa80);
      pcVar5 = &stack0xfffffffffffffc0c;
      ch_01 = (CHAR_DATA *)local_108;
      ch_00 = (CHAR_DATA *)&stack0xfffffffffffffc18;
      args_2 = act_queue;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[50],decltype(nullptr),decltype(nullptr),char_data*&,int>
                ((CQueue *)in_stack_fffffffffffffc20,0,(string *)0x0,
                 (string *)CONCAT44(1,in_stack_fffffffffffffc08),
                 (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                  *)in_stack_fffffffffffffc00,
                 (char (*) [50])CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 &in_stack_fffffffffffffc30->next,&in_stack_fffffffffffffc38->next,
                 &in_stack_fffffffffffffc40->next,(int *)in_stack_fffffffffffffc48);
      std::__cxx11::string::~string(local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc27);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc4f);
      pRVar6 = (ROOM_INDEX_DATA *)&stack0xfffffffffffffbd8;
      local_88._24_8_ = "A Hydra trooper tells you \'{}And stay out of Cimar, ye {}!{}\'\n\r";
      local_88._40_8_ = "A Hydra trooper tells you \'{}And stay out of Cimar, ye {}!{}\'\n\r";
      pcVar7 = "A Hydra trooper tells you \'{}And stay out of Cimar, ye {}!{}\'\n\r";
      local_88._32_8_ = pRVar6;
      local_88._48_8_ = pRVar6;
      pRVar4 = (ROOM_INDEX_DATA *)std::char_traits<char>::length((char_type *)0x6824a7);
      pRVar6->next_room = pRVar4;
      local_8 = (OBJ_DATA *)local_88._24_8_;
      this = (MOB_INDEX_DATA *)get_char_color(in_stack_fffffffffffffa68,pcVar5);
      pcVar5 = get_insult(ch_00);
      iVar3 = (int)((ulong)pcVar5 >> 0x20);
      from = (MEM_DATA *)END_COLOR(ch_01);
      __s = (PATHFIND_DATA *)&stack0xfffffffffffffbe8;
      local_90 = (MOB_INDEX_DATA *)&stack0xfffffffffffffbd0;
      local_98 = (PATHFIND_DATA *)&stack0xfffffffffffffbc8;
      local_a0 = (PATHFIND_DATA *)&stack0xfffffffffffffbc0;
      local_88._56_8_ = local_88;
      __a = (PATHFIND_DATA *)(local_108 + 0x10);
      local_b0 = (PC_DATA *)pcVar7;
      local_88._16_8_ = __s;
      local_88._64_8_ = pcVar7;
      fmt::v9::
      make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char*&,char*&>
                ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*,_char_*>
                  *)__a,(v9 *)local_90,(char **)local_98,(char **)local_a0,(char **)args_2);
      local_30 = (PATHFIND_DATA *)local_c0;
      local_18 = (char *)0xccc;
      local_c0._0_8_ = (ROOM_INDEX_DATA *)0xccc;
      local_88._80_8_ = __a;
      local_28 = __a;
      local_20 = __a;
      local_10 = local_30;
      local_c0._8_8_ = __a;
      fmt::v9::vformat_abi_cxx11_(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb0);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xfffffffffffffb9f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)__a)
      ;
      CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
                ((CQueue *)this,iVar3,(string *)from,in_stack_fffffffffffffbb8,
                 (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
                  *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                 (char_data **)in_stack_fffffffffffffbe0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb77);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffba0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb9f);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffbe8);
    }
  }
  return;
}

Assistant:

void fight_prog_law_subdue(CHAR_DATA *mob, CHAR_DATA *ch)
{
	CHAR_DATA *hydra, *dragon;
	int hydra_vnum, dragon_vnum, vnum = 0, num;
	ROOM_INDEX_DATA *pRoom;
	AFFECT_DATA af;
	float chance;

	switch (mob->pIndexData->vnum)
	{
		case 2410:
			hydra_vnum = 2409;
			dragon_vnum = 2408;
			break;
		default:
			dragon_vnum = mob->pIndexData->vnum + 1;
			hydra_vnum = mob->pIndexData->vnum + 2;
	}

	if (((hydra = get_char_room(mob, "hydra trooper soldier")) == nullptr)
		|| ((dragon = get_char_room(mob, "dragon trooper soldier")) == nullptr))
	{
		return;
	}

	if (!is_affected(ch, gsn_aggressor))
		return;

	chance = ((float)ch->hit / (float)ch->max_hit) * 100 + 10;

	if (number_percent() > chance)
	{
		stop_fighting(ch, true);
		stop_fighting(mob, true);

		mob->last_fought = nullptr;
		mob->tracktimer = 0;

		if (number_range(1, 2) == 1)
			act("The Hydra trooper dives at your legs, binding you, and you topple to the ground!", mob, 0, ch, TO_VICT);
		else
			act("You crumple as the Dragon trooper lands a hefty blow on the side of your head!", mob, 0, ch, TO_VICT);

		act("The troopers leap on top of you, and you find yourself quickly immobilized!", mob, 0, ch, TO_VICT);
		act("The troopers leap on top of $N, and $N finds $Mself quickly immobilized!", mob, 0, ch, TO_NOTVICT);
		act("You hear the wet sounds of impact against your skull, and everything goes black.", mob, 0, ch, TO_VICT);
		act("$N's inert form is dragged away toward the gates.", mob, 0, ch, TO_NOTVICT);

		ch->position = POS_SLEEPING;

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_subdue;
		af.aftype = AFT_INVIS;

		SET_BIT(af.bitvector, AFF_SLEEP);

		af.level = 60;
		af.duration = 12;
		affect_to_char(ch, &af);

		switch (mob->pIndexData->vnum)
		{
			case 2410:
				num = number_range(0, 4);

				switch (num)
				{
					case 0:
						vnum = 3502;
						break;
					case 1:
						vnum = 3507;
						break;
					case 2:
						vnum = 3509;
						break;
					case 3:
						vnum = 3516;
						break;
					case 4:
						vnum = 3517;
						break;
				}

				break;
			case 2700:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 533;
						break;
					case 1:
						vnum = 534;
						break;
					case 2:
						vnum = 542;
						break;
					case 3:
						vnum = 551;
						break;
				}

				break;
			case 2703:
				num = number_range(0, 4);

				switch (num)
				{
					case 0:
						vnum = 528;
						break;
					case 1:
						vnum = 529;
						break;
					case 2:
						vnum = 522;
						break;
					case 3:
						vnum = 523;
						break;
					case 4:
						vnum = 524;
						break;
				}

				break;
			case 2706:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2326;
						break;
					case 1:
						vnum = 2327;
						break;
					case 2:
						vnum = 2328;
						break;
					case 3:
						vnum = 2329;
						break;
				}

				break;
			case 2709:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 201;
						break;
					case 1:
						vnum = 202;
						break;
					case 2:
						vnum = 203;
						break;
					case 3:
						vnum = 204;
						break;
				}

				break;
			case 2712:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2319;
						break;
					case 1:
						vnum = 2320;
						break;
					case 2:
						vnum = 2321;
						break;
					case 3:
						vnum = 2323;
						break;
				}

				break;
			case 2715:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 2331;
						break;
					case 1:
						vnum = 2332;
						break;
					case 2:
						vnum = 2333;
						break;
					case 3:
						vnum = 2334;
						break;
				}

				break;
			case 2718:
				num = number_range(0, 3);

				switch (num)
				{
					case 0:
						vnum = 6008;
						break;
					case 1:
						vnum = 6009;
						break;
					case 2:
						vnum = 6011;
						break;
					case 3:
						vnum = 6014;
						break;
				}

				break;
			case 2721:
				num = number_range(0, 2);

				switch (num)
				{
					case 0:
						vnum = 14257;
						break;
					case 1:
						vnum = 14267;
						break;
					case 2:
						vnum = 14268;
						break;
				}

				break;
		}

		pRoom = get_room_index(vnum);

		if (is_affected(ch, gsn_plasma_thread))
			affect_strip(ch, gsn_plasma_thread);

		char_from_room(ch);
		char_to_room(ch, get_room_index(5));

		RS.Queue.AddToQueue(10, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, "You are dimly aware of being dragged along the ground...\n\r", ch);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "wake_up", wake_up, ch);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "affect_strip", affect_strip, ch, gsn_subdue);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "char_to_room", char_to_room, ch, pRoom);
		RS.Queue.AddToQueue(19, "fight_prog_law_subdue", "char_from_room", char_from_room, ch);
		RS.Queue.AddToQueue(20, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, "You are shaken awake by a fuzzy man, as seen through your own personal haze.\n\r", ch);
		RS.Queue.AddToQueue(20, "fight_prog_law_subdue", "act_queue", act_queue, "$N comes to $S knees holding the back of $S head.", nullptr, nullptr, ch, TO_NOTVICT);

		auto buffer = fmt::format("A Hydra trooper tells you '{}And stay out of Cimar, ye {}!{}'\n\r", get_char_color(ch, "tells"), get_insult(ch), END_COLOR(ch));
		RS.Queue.AddToQueue(21, "fight_prog_law_subdue", "send_to_char_queue", send_to_char_queue, buffer, ch);
	}
	else
	{
		act("The troopers maneuver around you, waiting for an opening.", mob, 0, ch, TO_VICT);
		act("The troopers maneuver around $N, waiting for an opening.", mob, 0, ch, TO_NOTVICT);
	}
}